

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O1

bool Test::run_tests(void)

{
  undefined8 *puVar1;
  _List_node_base *__s;
  byte bVar2;
  Registry *pRVar3;
  size_t sVar4;
  undefined8 uVar5;
  Registry *pRVar6;
  ostream *poVar7;
  long *plVar8;
  bool bVar9;
  _List_node_base *p_Var10;
  char *pcVar11;
  char local_39 [9];
  
  pRVar3 = Registry::getInstance();
  pRVar6 = (Registry *)
           (pRVar3->tests).super__List_base<Test_*,_std::allocator<Test_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (pRVar6 == pRVar3) {
    bVar9 = true;
  }
  else {
    bVar9 = true;
    do {
      puVar1 = (undefined8 *)
               (pRVar6->tests).super__List_base<Test_*,_std::allocator<Test_*>_>._M_impl._M_node.
               _M_size;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Testing: ",9);
      pcVar11 = (char *)*puVar1;
      if (pcVar11 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x111110);
      }
      else {
        sVar4 = strlen(pcVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar11,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"... ",4);
      std::ostream::flush();
      if (puVar1[3] == 0) {
        uVar5 = std::__throw_bad_function_call();
        __cxa_end_catch();
        _Unwind_Resume(uVar5);
      }
      bVar2 = (*(code *)puVar1[4])(puVar1 + 1);
      pcVar11 = "FAILED!";
      if (bVar2 != 0) {
        pcVar11 = "Ok.";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,pcVar11,(ulong)(bVar2 ^ 1) * 4 + 3);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
      bVar9 = (bool)(bVar9 & bVar2);
      pRVar6 = (Registry *)
               (pRVar6->tests).super__List_base<Test_*,_std::allocator<Test_*>_>._M_impl._M_node.
               super__List_node_base._M_next;
    } while (pRVar6 != pRVar3);
  }
  pRVar6 = Registry::getInstance();
  if ((pRVar6->marks).
      super__List_base<std::pair<const_char_*,_int>,_std::allocator<std::pair<const_char_*,_int>_>_>
      ._M_impl._M_node._M_size != 0) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
    std::ostream::put('\x10');
    poVar7 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Marked lines:",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    pRVar6 = Registry::getInstance();
    p_Var10 = (pRVar6->marks).
              super__List_base<std::pair<const_char_*,_int>,_std::allocator<std::pair<const_char_*,_int>_>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var10 != (_List_node_base *)&pRVar6->marks) {
      do {
        __s = p_Var10[1]._M_next;
        if (__s == (_List_node_base *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x111110);
        }
        else {
          sVar4 = strlen((char *)__s);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)__s,sVar4);
        }
        local_39[0] = ':';
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_39,1);
        plVar8 = (long *)std::ostream::operator<<(poVar7,*(int *)&p_Var10[1]._M_prev);
        std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
        std::ostream::put((char)plVar8);
        std::ostream::flush();
        p_Var10 = p_Var10->_M_next;
      } while (p_Var10 != (_List_node_base *)&pRVar6->marks);
    }
  }
  return bVar9;
}

Assistant:

bool Test::run_tests()
{
	using namespace std;

	bool success = true;
	for (Test *test : Registry::getInstance().tests)
	{
		cout << "Testing: " << test->description << "... " << flush;
		bool ret = false;
		try
		{
			ret = test->body();
			cout << (ret ? "Ok." : "FAILED!") << endl;
		}
		catch (std::exception &e)
			{ cout << "FAILED!" << endl << '\t' << e.what() << endl; }
		catch (...)
			{ cout << "FAILED!\n\tAn undetermined exception occurred!" << endl; }
		success &= ret;
	}

	if (Registry::getInstance().marks.size() > 0)
	{
		cout << endl << "Marked lines:" << endl;
		for (Registry::Mark &mark : Registry::getInstance().marks)
			cout << mark.first << ':' << mark.second << endl;
	}

	return success;
}